

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O0

set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
__thiscall
dg::dda::DefinitionsMap<dg::dda::RWNode>::get(DefinitionsMap<dg::dda::RWNode> *this,DefSite *ds)

{
  bool bVar1;
  tuple<dg::Offset_&,_dg::Offset_&> *in_RSI;
  pair<dg::Offset,_dg::Offset> *in_RDI;
  pair<dg::Offset,_dg::Offset> pVar2;
  Offset end;
  Offset start;
  iterator it;
  unordered_map<dg::dda::RWNode_*,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>,_std::hash<dg::dda::RWNode_*>,_std::equal_to<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>_>
  *in_stack_ffffffffffffff78;
  pair<dg::Offset,_dg::Offset> *__in;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *in_stack_ffffffffffffffa8;
  Offset in_stack_ffffffffffffffb0;
  Offset start_00;
  Offset local_38;
  Offset local_30;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
  local_20 [4];
  
  __in = in_RDI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<dg::dda::RWNode_*,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>,_std::hash<dg::dda::RWNode_*>,_std::equal_to<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x178e5a);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<dg::dda::RWNode_*,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>,_std::hash<dg::dda::RWNode_*>,_std::equal_to<dg::dda::RWNode_*>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    memset(in_RDI,0,0x30);
    std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
    set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
        0x178e9e);
  }
  else {
    Offset::Offset(&local_30,Offset::UNKNOWN);
    Offset::Offset(&local_38,Offset::UNKNOWN);
    pVar2 = getInterval((DefSite *)in_stack_ffffffffffffffb0.offset);
    start_00 = pVar2.first.offset;
    std::tie<dg::Offset,dg::Offset>(&__in->first,&in_RDI->first);
    std::tuple<dg::Offset&,dg::Offset&>::operator=(in_RSI,__in);
    std::__detail::
    _Node_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false,_false>
                  *)0x178f0c);
    ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::gather
              (in_stack_ffffffffffffffa8,start_00,in_stack_ffffffffffffffb0);
  }
  return (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
         )__in;
}

Assistant:

std::set<NodeT *> get(const DefSite &ds) {
        auto it = _definitions.find(ds.target);
        if (it == _definitions.end())
            return {};

        Offset start, end;
        std::tie(start, end) = getInterval(ds);
        return it->second.gather(start, end);
    }